

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_bde.c
# Opt level: O1

err_t beltBDEDecr(void *dest,void *src,size_t count,octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  blob_t state;
  err_t eVar2;
  
  eVar2 = 0x6d;
  if (((0xf < count && (count & 0xf) == 0) && (len < 0x21)) &&
     ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(src,count);
    if (bVar1 != 0) {
      bVar1 = memIsValid(key,len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(iv,0x10);
        if (bVar1 != 0) {
          bVar1 = memIsValid(dest,count);
          if (bVar1 != 0) {
            state = blobCreate(0x40);
            if (state == (blob_t)0x0) {
              eVar2 = 0x6e;
            }
            else {
              beltBDEStart(state,key,len,iv);
              memMove(dest,src,count);
              beltBDEStepD(dest,count,state);
              blobClose(state);
              eVar2 = 0;
            }
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltBDEDecr(void* dest, const void* src, size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (count % 16 != 0 || count < 16 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltBDE_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// расшифровать
	beltBDEStart(state, key, len, iv);
	memMove(dest, src, count);
	beltBDEStepD(dest, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}